

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutengine.cpp
# Opt level: O0

QSize qSmartMaxSize(QWidgetItem *i,Alignment align)

{
  long lVar1;
  QFlagsStorage<Qt::AlignmentFlag> align_00;
  QSize *this;
  QSize QVar2;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  QWidget *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QSize *)(**(code **)(*(long *)in_RDI + 0x68))();
  align_00.i = (**(code **)((long)*this + 0x70))();
  (**(code **)((long)*this + 0x78))();
  QSize::expandedTo(this,(QSize *)in_stack_ffffffffffffffa0);
  QWidget::minimumSize(in_RDI);
  QWidget::maximumSize(in_RDI);
  QWidget::sizePolicy(in_stack_ffffffffffffffa0);
  QVar2 = qSmartMaxSize((QSize *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        (QSize *)in_RDI,this,(QSizePolicy *)in_stack_ffffffffffffffa0,
                        (Alignment)align_00.i);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

Q_WIDGETS_EXPORT QSize qSmartMaxSize(const QWidgetItem *i, Qt::Alignment align)
{
    QWidget *w = i->widget();
    return qSmartMaxSize(w->sizeHint().expandedTo(w->minimumSizeHint()), w->minimumSize(), w->maximumSize(),
                            w->sizePolicy(), align);
}